

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::populateUi(UEFITool *this,QModelIndex *current)

{
  QString *pQVar1;
  QAction *pQVar2;
  bool bVar3;
  bool local_91;
  bool local_81;
  QString local_38;
  UINT8 local_1a;
  UINT8 local_19;
  UINT8 subtype;
  QModelIndex *pQStack_18;
  UINT8 type;
  QModelIndex *current_local;
  UEFITool *this_local;
  
  pQStack_18 = current;
  current_local = (QModelIndex *)this;
  bVar3 = QModelIndex::isValid(current);
  if (bVar3) {
    local_19 = TreeModel::type(this->model,pQStack_18);
    local_1a = TreeModel::subtype(this->model,pQStack_18);
    pQVar1 = *(QString **)(this->ui + 0x148);
    TreeModel::info(&local_38,this->model,pQStack_18);
    QPlainTextEdit::setPlainText(pQVar1);
    QString::~QString(&local_38);
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x200),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x208),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x210),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x218),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x220),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x228),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x230),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x240),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x248),0));
    pQVar2 = *(QAction **)(this->ui + 0xa8);
    bVar3 = TreeModel::hasEmptyHeader(this->model,pQStack_18);
    local_81 = false;
    if (bVar3) {
      bVar3 = TreeModel::hasEmptyBody(this->model,pQStack_18);
      local_81 = false;
      if (bVar3) {
        local_81 = TreeModel::hasEmptyTail(this->model,pQStack_18);
      }
    }
    QAction::setDisabled(pQVar2,local_81);
    pQVar2 = *(QAction **)(this->ui + 0xb8);
    bVar3 = TreeModel::hasEmptyBody(this->model,pQStack_18);
    QAction::setDisabled(pQVar2,bVar3);
    pQVar2 = *(QAction **)(this->ui + 0xc0);
    bVar3 = TreeModel::hasEmptyUncompressedData(this->model,pQStack_18);
    QAction::setDisabled(pQVar2,bVar3);
    pQVar2 = *(QAction **)(this->ui + 0x18);
    bVar3 = TreeModel::hasEmptyHeader(this->model,pQStack_18);
    local_91 = false;
    if (bVar3) {
      bVar3 = TreeModel::hasEmptyBody(this->model,pQStack_18);
      local_91 = false;
      if (bVar3) {
        local_91 = TreeModel::hasEmptyTail(this->model,pQStack_18);
      }
    }
    QAction::setDisabled(pQVar2,local_91);
    QAction::setEnabled(SUB81(*(undefined8 *)(this->ui + 0xa0),0));
    pQVar2 = *(QAction **)(this->ui + 0x20);
    bVar3 = TreeModel::hasEmptyBody(this->model,pQStack_18);
    QAction::setDisabled(pQVar2,bVar3);
    pQVar2 = *(QAction **)(this->ui + 0x98);
    bVar3 = TreeModel::hasEmptyUncompressedData(this->model,pQStack_18);
    QAction::setDisabled(pQVar2,bVar3);
    QWidget::setEnabled(SUB81(*(undefined8 *)(this->ui + 0x238),0));
  }
  return;
}

Assistant:

void UEFITool::populateUi(const QModelIndex &current)
{
    // Check sanity
    if (!current.isValid()) {
        return;
    }
    
    UINT8 type = model->type(current);
    UINT8 subtype = model->subtype(current);
    
    // Set info text
    ui->infoEdit->setPlainText(model->info(current));
    
    // Enable menus
    ui->menuCapsuleActions->setEnabled(type == Types::Capsule);
    ui->menuImageActions->setEnabled(type == Types::Image);
    ui->menuRegionActions->setEnabled(type == Types::Region);
    ui->menuPaddingActions->setEnabled(type == Types::Padding);
    ui->menuVolumeActions->setEnabled(type == Types::Volume);
    ui->menuFileActions->setEnabled(type == Types::File);
    ui->menuSectionActions->setEnabled(type == Types::Section);
    ui->menuEntryActions->setEnabled(type == Types::Microcode
                                     || type == Types::SlicData
                                     || type == Types::NvarEntry
                                     || type == Types::VssEntry
                                     || type == Types::SysFEntry
                                     || type == Types::EvsaEntry
                                     || type == Types::PhoenixFlashMapEntry
                                     || type == Types::InsydeFlashDeviceMapEntry
                                     || type == Types::IfwiHeader
                                     || type == Types::IfwiPartition
                                     || type == Types::FptPartition
                                     || type == Types::FptEntry
                                     || type == Types::BpdtPartition
                                     || type == Types::BpdtEntry
                                     || type == Types::CpdPartition
                                     || type == Types::CpdEntry
                                     || type == Types::CpdExtension
                                     || type == Types::CpdSpiEntry
                                     || type == Types::StartupApDataEntry
                                     );
    ui->menuStoreActions->setEnabled(type == Types::VssStore
                                     || type == Types::Vss2Store
                                     || type == Types::FdcStore
                                     || type == Types::SysFStore
                                     || type == Types::EvsaStore
                                     || type == Types::FtwStore
                                     || type == Types::PhoenixFlashMapStore
                                     || type == Types::InsydeFlashDeviceMapStore
                                     || type == Types::NvarGuidStore
                                     || type == Types::CmdbStore
                                     || type == Types::FptStore
                                     || type == Types::BpdtStore
                                     || type == Types::CpdStore
                                     );
    
    // Enable actions
    ui->actionHexView->setDisabled(model->hasEmptyHeader(current) && model->hasEmptyBody(current) && model->hasEmptyTail(current));
    ui->actionBodyHexView->setDisabled(model->hasEmptyBody(current));
    ui->actionUncompressedHexView->setDisabled(model->hasEmptyUncompressedData(current));
    ui->actionExtract->setDisabled(model->hasEmptyHeader(current) && model->hasEmptyBody(current) && model->hasEmptyTail(current));
    ui->actionGoToData->setEnabled(type == Types::NvarEntry && subtype == Subtypes::LinkNvarEntry);
    
    // Disable rebuild for now
    //ui->actionRebuild->setDisabled(type == Types::Region && subtype == Subtypes::DescriptorRegion);
    //ui->actionReplace->setDisabled(type == Types::Region && subtype == Subtypes::DescriptorRegion);
    
    //ui->actionRebuild->setEnabled(type == Types::Volume || type == Types::File || type == Types::Section);
    ui->actionExtractBody->setDisabled(model->hasEmptyBody(current));
    ui->actionExtractBodyUncompressed->setDisabled(model->hasEmptyUncompressedData(current));
    //ui->actionRemove->setEnabled(type == Types::Volume || type == Types::File || type == Types::Section);
    //ui->actionInsertInto->setEnabled((type == Types::Volume && subtype != Subtypes::UnknownVolume) ||
    //    (type == Types::File && subtype != EFI_FV_FILETYPE_ALL && subtype != EFI_FV_FILETYPE_RAW && subtype != EFI_FV_FILETYPE_PAD) ||
    //    (type == Types::Section && (subtype == EFI_SECTION_COMPRESSION || subtype == EFI_SECTION_GUID_DEFINED || subtype == EFI_SECTION_DISPOSABLE)));
    //ui->actionInsertBefore->setEnabled(type == Types::File || type == Types::Section);
    //ui->actionInsertAfter->setEnabled(type == Types::File || type == Types::Section);
    //ui->actionReplace->setEnabled((type == Types::Region && subtype != Subtypes::DescriptorRegion) || type == Types::Volume || type == Types::File || type == Types::Section);
    //ui->actionReplaceBody->setEnabled(type == Types::Volume || type == Types::File || type == Types::Section);
    
    ui->menuMessageActions->setEnabled(false);
}